

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

PNode * heap_pop(VecPNode *a)

{
  uint local_24;
  int i;
  PNode *pn;
  VecPNode *a_local;
  
  if (a->n == 0) {
    a_local = (VecPNode *)0x0;
  }
  else {
    a_local = (VecPNode *)*a->v;
    *a->v = a->v[a->n - 1];
    a->n = a->n - 1;
    local_24 = a->n >> 1;
    while (local_24 = local_24 - 1, -1 < (int)local_24) {
      heapify(a,local_24);
    }
  }
  return (PNode *)a_local;
}

Assistant:

PNode *heap_pop(VecPNode *a) {
  if (a->n == 0) return NULL;
  PNode *pn = a->v[0];
  a->v[0] = a->v[a->n -1];
  a->n--;
  for (int i = a->n / 2 - 1; i >= 0; i--)
    heapify(a, i);
  return pn;
}